

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.c
# Opt level: O3

void cmsysMD5_Append(cmsysMD5 *md5,uchar *data,int length)

{
  size_t nbytes;
  
  if (length < 0) {
    nbytes = strlen((char *)data);
  }
  else {
    nbytes = (size_t)(uint)length;
  }
  md5_append(&md5->md5_state,data,nbytes);
  return;
}

Assistant:

void kwsysMD5_Append(kwsysMD5* md5, unsigned char const* data, int length)
{
  size_t dlen;
  if (length < 0) {
    dlen = strlen((char const*)data);
  } else {
    dlen = (size_t)length;
  }
  md5_append(&md5->md5_state, (md5_byte_t const*)data, dlen);
}